

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> * __thiscall
vk::DescriptorSetLayoutBuilder::build
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,
          DescriptorSetLayoutBuilder *this,DeviceInterface *vk,VkDevice device,
          VkDescriptorSetLayoutCreateFlags extraFlags)

{
  bool bVar1;
  ImmutableSamplerInfo *pIVar2;
  const_reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  VkDescriptorSetLayoutBinding *local_c0;
  undefined1 local_78 [8];
  VkDescriptorSetLayoutCreateInfo createInfo;
  ImmutableSamplerInfo *samplerInfo;
  size_t samplerInfoNdx;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayoutCreateFlags extraFlags_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  DescriptorSetLayoutBuilder *this_local;
  
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = extraFlags;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)&samplerInfoNdx,&this->m_bindings);
  samplerInfo = (ImmutableSamplerInfo *)0x0;
  while( true ) {
    pIVar2 = (ImmutableSamplerInfo *)
             std::
             vector<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
             ::size(&this->m_immutableSamplerInfos);
    if (pIVar2 <= samplerInfo) break;
    createInfo.pBindings =
         (VkDescriptorSetLayoutBinding *)
         std::
         vector<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ::operator[](&this->m_immutableSamplerInfos,(size_type)samplerInfo);
    pvVar3 = std::
             vector<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ::operator[](&this->m_immutableSamplers,(ulong)(createInfo.pBindings)->descriptorType);
    pvVar4 = std::
             vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ::operator[]((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                           *)&samplerInfoNdx,(ulong)(createInfo.pBindings)->binding);
    pvVar4->pImmutableSamplers = pvVar3;
    samplerInfo = (ImmutableSamplerInfo *)((long)&samplerInfo->bindingIndex + 1);
  }
  local_78._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ =
       bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  sVar5 = std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::size((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                  *)&samplerInfoNdx);
  createInfo.pNext._4_4_ = (undefined4)sVar5;
  bVar1 = std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::empty((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                   *)&samplerInfoNdx);
  if (bVar1) {
    local_c0 = (VkDescriptorSetLayoutBinding *)0x0;
  }
  else {
    local_c0 = std::
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ::data((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       *)&samplerInfoNdx);
  }
  createInfo._16_8_ = local_c0;
  createDescriptorSetLayout
            (__return_storage_ptr__,vk,device,(VkDescriptorSetLayoutCreateInfo *)local_78,
             (VkAllocationCallbacks *)0x0);
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)&samplerInfoNdx);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSetLayout> DescriptorSetLayoutBuilder::build (const DeviceInterface& vk, VkDevice device, VkDescriptorSetLayoutCreateFlags extraFlags) const
{
	// Create new layout bindings with pImmutableSamplers updated
	std::vector<VkDescriptorSetLayoutBinding>	bindings	= m_bindings;

	for (size_t samplerInfoNdx = 0; samplerInfoNdx < m_immutableSamplerInfos.size(); samplerInfoNdx++)
	{
		const ImmutableSamplerInfo&	samplerInfo	= m_immutableSamplerInfos[samplerInfoNdx];

		bindings[samplerInfo.bindingIndex].pImmutableSamplers	= &m_immutableSamplers[samplerInfo.samplerBaseIndex];
	}

	const VkDescriptorSetLayoutCreateInfo		createInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
		DE_NULL,
		(VkDescriptorSetLayoutCreateFlags)extraFlags,			// flags
		(deUint32)bindings.size(),								// bindingCount
		(bindings.empty()) ? (DE_NULL) : (bindings.data()),		// pBinding
	};

	return createDescriptorSetLayout(vk, device, &createInfo);
}